

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall
HighsCutGeneration::generateCut
          (HighsCutGeneration *this,HighsTransformedLp *transLp,
          vector<int,_std::allocator<int>_> *inds_,vector<double,_std::allocator<double>_> *vals_,
          double *rhs_,bool onlyInitialCMIRScale)

{
  bool bVar1;
  HighsInt HVar2;
  size_type sVar3;
  int *piVar4;
  double *pdVar5;
  reference pvVar6;
  pointer pHVar7;
  HighsSolution *pHVar8;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 *in_RDI;
  double *in_R8;
  byte in_R9B;
  double dVar9;
  bool in_stack_00000025;
  bool in_stack_00000026;
  bool in_stack_00000027;
  double in_stack_00000028;
  bool in_stack_00000035;
  bool in_stack_00000036;
  bool in_stack_00000037;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  HighsCutGeneration *in_stack_00000048;
  bool *in_stack_00000050;
  HighsCutGeneration *in_stack_00000058;
  HighsInt cutindex;
  HighsInt i_2;
  vector<double,_std::allocator<double>_> *sol;
  HighsCDouble violation;
  double *in_stack_00000090;
  vector<int,_std::allocator<int>_> *in_stack_00000098;
  vector<double,_std::allocator<double>_> *in_stack_000000a0;
  HighsInt i_1;
  HighsInt i;
  bool in_stack_000000ac;
  bool hasContinuous;
  bool hasGeneralInts;
  bool hasUnboundedInts;
  double in_stack_000000b0;
  HighsInt in_stack_000000bc;
  undefined7 in_stack_000000c0;
  bool intsPositive;
  bool in_stack_000001bf;
  double *in_stack_000001c0;
  vector<int,_std::allocator<int>_> *in_stack_000001c8;
  vector<double,_std::allocator<double>_> *in_stack_000001d0;
  vector<double,_std::allocator<double>_> *in_stack_000001d8;
  vector<double,_std::allocator<double>_> *in_stack_000001e0;
  HighsTransformedLp *in_stack_000001e8;
  bool *in_stack_00000200;
  byte *pbVar10;
  double other;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffff1c;
  HighsCDouble *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  HighsCutGeneration *in_stack_ffffffffffffff30;
  int local_84;
  HighsCDouble local_78;
  double local_68;
  double *in_stack_ffffffffffffffa0;
  int len;
  int in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 uVar13;
  undefined1 uVar14;
  byte bVar15;
  HighsInt *in_stack_ffffffffffffffb8;
  HighsDomain *in_stack_ffffffffffffffc0;
  byte local_32;
  byte local_31;
  double *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  bool local_1;
  
  local_31 = in_R9B & 1;
  local_32 = 1;
  pbVar10 = &local_32;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  bVar1 = HighsTransformedLp::transform
                    (in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
                     in_stack_000001c8,in_stack_000001c0,in_stack_00000200,in_stack_000001bf);
  if (bVar1) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(local_20);
    *(int *)((long)in_RDI + 0xe4) = (int)sVar3;
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x591f80);
    in_RDI[0x19] = piVar4;
    pdVar5 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x591f9c);
    in_RDI[0x18] = pdVar5;
    HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffffb8,*local_30);
    in_RDI[0x1a] = in_stack_ffffffffffffffb8;
    in_RDI[0x1b] = in_stack_ffffffffffffffc0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x591ff3);
    bVar15 = 0;
    uVar14 = 0;
    uVar13 = 0;
    bVar1 = preprocessBaseInequality
                      (in_stack_00000058,in_stack_00000050,(bool *)in_stack_00000048,
                       (bool *)in_stack_00000040);
    uVar11 = (undefined4)((ulong)pbVar10 >> 0x20);
    if (bVar1) {
      if (((bVar15 & 1) == 0) && ((local_32 & 1) == 0)) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        for (in_stack_ffffffffffffffb0 = 0; uVar11 = (undefined4)((ulong)pbVar10 >> 0x20),
            in_stack_ffffffffffffffb0 != *(int *)((long)in_RDI + 0xe4);
            in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
          if ((*(double *)(in_RDI[0x18] + (long)in_stack_ffffffffffffffb0 * 8) <= 0.0) &&
             (pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  (in_RDI + 0x13),(long)in_stack_ffffffffffffffb0), *pvVar6 != '\0')
             ) {
            flipComplementation(in_stack_ffffffffffffff30,
                                (HighsInt)(in_stack_ffffffffffffff28 >> 0x20));
          }
        }
      }
      other = (double)CONCAT44(uVar11,(uint)(local_31 & 1));
      uVar11 = 1;
      uVar12 = 1;
      bVar1 = tryGenerateCut(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000037
                             ,in_stack_00000036,in_stack_00000035,in_stack_00000028,
                             in_stack_00000027,in_stack_00000026,in_stack_00000025);
      if (bVar1) {
        removeComplementation((HighsCutGeneration *)CONCAT44(in_stack_ffffffffffffff14,uVar11));
        len = *(int *)((long)in_RDI + 0xe4);
        while (len = len + -1, -1 < len) {
          dVar9 = *(double *)(in_RDI[0x18] + (long)len * 8);
          if ((dVar9 == 0.0) && (!NAN(dVar9))) {
            *(int *)((long)in_RDI + 0xe4) = *(int *)((long)in_RDI + 0xe4) + -1;
            *(undefined4 *)(in_RDI[0x19] + (long)len * 4) =
                 *(undefined4 *)(in_RDI[0x19] + (long)*(int *)((long)in_RDI + 0xe4) * 4);
            *(undefined8 *)(in_RDI[0x18] + (long)len * 8) =
                 *(undefined8 *)(in_RDI[0x18] + (long)*(int *)((long)in_RDI + 0xe4) * 8);
          }
        }
        dVar9 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0x1a));
        *local_30 = dVar9;
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
        bVar1 = HighsTransformedLp::untransform
                          ((HighsTransformedLp *)
                           CONCAT17(hasUnboundedInts,
                                    CONCAT16(hasGeneralInts,
                                             CONCAT15(hasContinuous,CONCAT14(in_stack_000000ac,i))))
                           ,in_stack_000000a0,in_stack_00000098,in_stack_00000090,violation.lo._7_1_
                          );
        if (bVar1) {
          sVar3 = std::vector<int,_std::allocator<int>_>::size(local_20);
          *(int *)((long)in_RDI + 0xe4) = (int)sVar3;
          piVar4 = std::vector<int,_std::allocator<int>_>::data
                             ((vector<int,_std::allocator<int>_> *)0x5922fa);
          in_RDI[0x19] = piVar4;
          pdVar5 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x592316);
          in_RDI[0x18] = pdVar5;
          HighsCDouble::HighsCDouble((HighsCDouble *)&local_68,*local_30);
          in_RDI[0x1a] = local_68;
          in_RDI[0x1b] = in_stack_ffffffffffffffa0;
          HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x592378);
          HighsDebugSol::checkCut
                    ((HighsDebugSol *)&pHVar7->field_0x68b0,(HighsInt *)in_RDI[0x19],
                     (double *)in_RDI[0x18],*(HighsInt *)((long)in_RDI + 0xe4),*local_30);
          bVar1 = postprocessCut((HighsCutGeneration *)sol);
          if (bVar1) {
            dVar9 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0x1a));
            *local_30 = dVar9;
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
            HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
            pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x592432);
            piVar4 = std::vector<int,_std::allocator<int>_>::data
                               ((vector<int,_std::allocator<int>_> *)0x59244a);
            pdVar5 = std::vector<double,_std::allocator<double>_>::data
                               ((vector<double,_std::allocator<double>_> *)0x59245c);
            HighsDebugSol::checkCut
                      ((HighsDebugSol *)&pHVar7->field_0x68b0,piVar4,pdVar5,
                       *(HighsInt *)((long)in_RDI + 0xe4),*local_30);
            HighsCDouble::HighsCDouble(&local_78,-*local_30);
            pHVar8 = HighsLpRelaxation::getSolution((HighsLpRelaxation *)0x5924c2);
            for (local_84 = 0; local_84 != *(int *)((long)in_RDI + 0xe4); local_84 = local_84 + 1) {
              std::vector<double,_std::allocator<double>_>::operator[]
                        (&pHVar8->col_value,(long)*(int *)(in_RDI[0x19] + (long)local_84 * 4));
              std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_84);
              HighsCDouble::operator+=
                        (in_stack_ffffffffffffff20,
                         (double)CONCAT44(in_stack_ffffffffffffff1c,uVar12));
            }
            bVar1 = HighsCDouble::operator<=
                              ((HighsCDouble *)CONCAT44(in_stack_ffffffffffffff14,uVar11),other);
            if (bVar1) {
              local_1 = false;
            }
            else {
              HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
              std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x592594);
              HighsDomain::tightenCoefficients
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (double *)
                         CONCAT17(bVar15,CONCAT16(uVar14,CONCAT15(uVar13,CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0)))),len,
                         in_stack_ffffffffffffffa0);
              HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
              std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x5925ec);
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x5925fe);
              std::vector<int,_std::allocator<int>_>::size(local_20);
              HVar2 = HighsCutPool::addCut
                                ((HighsCutPool *)inds_,(HighsMipSolver *)vals_,(HighsInt *)rhs_,
                                 (double *)CONCAT17(onlyInitialCMIRScale,in_stack_000000c0),
                                 in_stack_000000bc,in_stack_000000b0,hasUnboundedInts,hasGeneralInts
                                 ,hasContinuous,in_stack_000000ac);
              local_1 = HVar2 != -1;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsCutGeneration::generateCut(HighsTransformedLp& transLp,
                                     std::vector<HighsInt>& inds_,
                                     std::vector<double>& vals_, double& rhs_,
                                     bool onlyInitialCMIRScale) {
#if 0
  if (vals_.size() > 1) {
    std::vector<HighsInt> indsCheck_ = inds_;
    std::vector<double> valsCheck_ = vals_;
    double tmprhs_ = rhs_;
    bool intsPositive = true;
    if (!transLp.transform(valsCheck_, upper, solval, indsCheck_, tmprhs_,
                           intsPositive))
      return false;

    rowlen = indsCheck_.size();
    this->inds = indsCheck_.data();
    this->vals = valsCheck_.data();
    this->rhs = tmprhs_;
    complementation.clear();
    bool hasUnboundedInts = false;
    bool hasGeneralInts = false;
    bool hasContinuous = false;
    // printf("before preprocessing of base inequality:\n");
    checkNumerics(vals, rowlen, double(rhs));
    if (!preprocessBaseInequality(hasUnboundedInts, hasGeneralInts,
                                  hasContinuous))
      return false;
    // printf("after preprocessing of base inequality:\n");
    checkNumerics(vals, rowlen, double(rhs));

    tmprhs_ = (double)rhs;
    valsCheck_.resize(rowlen);
    indsCheck_.resize(rowlen);
    if (!transLp.untransform(valsCheck_, indsCheck_, tmprhs_)) return false;

    // printf("after untransform of base inequality:\n");
    checkNumerics(vals, rowlen, double(rhs));

    // finally check whether the cut is violated
    rowlen = indsCheck_.size();
    inds = indsCheck_.data();
    vals = valsCheck_.data();
    lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(
        inds, vals, rowlen, tmprhs_);
  }
#endif

  bool intsPositive = true;
  if (!transLp.transform(vals_, upper, solval, inds_, rhs_, intsPositive))
    return false;

  rowlen = inds_.size();
  this->inds = inds_.data();
  this->vals = vals_.data();
  this->rhs = rhs_;
  complementation.clear();
  bool hasUnboundedInts = false;
  bool hasGeneralInts = false;
  bool hasContinuous = false;
  if (!preprocessBaseInequality(hasUnboundedInts, hasGeneralInts,
                                hasContinuous))
    return false;

  // it can happen that there is an unbounded integer variable during the
  // transform call so that the integers are not transformed to positive values.
  // Now the call to preprocessBaseInequality may have removed the unbounded
  // integer, e.g. due to a small coefficient value, so that we can still use
  // the lifted inequalities instead of cmir. We need to make sure, however,
  // that the cut values are transformed to positive coefficients first, which
  // we do below.
  if (!hasUnboundedInts && !intsPositive) {
    complementation.resize(rowlen);

    for (HighsInt i = 0; i != rowlen; ++i) {
      if (vals[i] > 0 || !isintegral[i]) continue;

      flipComplementation(i);
    }
  }

  // try to generate a cut
  if (!tryGenerateCut(inds_, vals_, hasUnboundedInts, hasGeneralInts,
                      hasContinuous, 10 * feastol, onlyInitialCMIRScale))
    return false;

  // remove the complementation if exists
  removeComplementation();

  // remove zeros in place
  for (HighsInt i = rowlen - 1; i >= 0; --i) {
    if (vals[i] == 0.0) {
      --rowlen;
      inds[i] = inds[rowlen];
      vals[i] = vals[rowlen];
    }
  }

  // transform the cut back into the original space, i.e. remove the bound
  // substitution and replace implicit slack variables
  rhs_ = (double)rhs;
  vals_.resize(rowlen);
  inds_.resize(rowlen);
  if (!transLp.untransform(vals_, inds_, rhs_)) return false;

  rowlen = inds_.size();
  inds = inds_.data();
  vals = vals_.data();
  rhs = rhs_;

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(inds, vals,
                                                               rowlen, rhs_);
  // apply cut postprocessing including scaling and removal of small
  // coefficients
  if (!postprocessCut()) return false;
  rhs_ = (double)rhs;
  vals_.resize(rowlen);
  inds_.resize(rowlen);

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(
      inds_.data(), vals_.data(), rowlen, rhs_);

  // finally determine the violation of the cut in the original space
  HighsCDouble violation = -rhs_;
  const auto& sol = lpRelaxation.getSolution().col_value;
  for (HighsInt i = 0; i != rowlen; ++i) violation += sol[inds[i]] * vals_[i];

  if (violation <= 10 * feastol) return false;

  lpRelaxation.getMipSolver().mipdata_->domain.tightenCoefficients(
      inds, vals, rowlen, rhs_);

  // if the cut is violated by a small factor above the feasibility
  // tolerance, add it to the cutpool
  HighsInt cutindex = cutpool.addCut(lpRelaxation.getMipSolver(), inds_.data(),
                                     vals_.data(), inds_.size(), rhs_,
                                     integralSupport && integralCoefficients);

  // only return true if cut was accepted by the cutpool, i.e. not a duplicate
  // of a cut already in the pool
  return cutindex != -1;
}